

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

void __thiscall duckdb::DropInfo::Serialize(DropInfo *this,Serializer *serializer)

{
  ParseInfo::Serialize(&this->super_ParseInfo,serializer);
  Serializer::WriteProperty<duckdb::CatalogType>
            (serializer,200,"type",&(this->super_ParseInfo).field_0x9);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,0xc9,"catalog",&this->catalog);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xca,"schema",&this->schema)
  ;
  Serializer::WritePropertyWithDefault<std::__cxx11::string>(serializer,0xcb,"name",&this->name);
  Serializer::WriteProperty<duckdb::OnEntryNotFound>
            (serializer,0xcc,"if_not_found",&this->if_not_found);
  Serializer::WritePropertyWithDefault<bool>(serializer,0xcd,"cascade",&this->cascade);
  Serializer::WritePropertyWithDefault<bool>
            (serializer,0xce,"allow_drop_internal",&this->allow_drop_internal);
  Serializer::
  WritePropertyWithDefault<duckdb::unique_ptr<duckdb::ExtraDropInfo,std::default_delete<duckdb::ExtraDropInfo>,true>>
            (serializer,0xcf,"extra_drop_info",&this->extra_drop_info);
  return;
}

Assistant:

void DropInfo::Serialize(Serializer &serializer) const {
	ParseInfo::Serialize(serializer);
	serializer.WriteProperty<CatalogType>(200, "type", type);
	serializer.WritePropertyWithDefault<string>(201, "catalog", catalog);
	serializer.WritePropertyWithDefault<string>(202, "schema", schema);
	serializer.WritePropertyWithDefault<string>(203, "name", name);
	serializer.WriteProperty<OnEntryNotFound>(204, "if_not_found", if_not_found);
	serializer.WritePropertyWithDefault<bool>(205, "cascade", cascade);
	serializer.WritePropertyWithDefault<bool>(206, "allow_drop_internal", allow_drop_internal);
	serializer.WritePropertyWithDefault<unique_ptr<ExtraDropInfo>>(207, "extra_drop_info", extra_drop_info);
}